

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O2

bool __thiscall GF2::WW<12UL>::Next(WW<12UL> *this,bool saveWeight)

{
  ulong uVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = this->_words[0];
  if ((int)CONCAT71(in_register_00000031,saveWeight) == 0) {
    uVar1 = uVar1 + 1;
    this->_words[0] = uVar1;
    if (uVar1 != 0) {
      this->_words[0] = uVar1 & 0xfff;
      return (uVar1 & 0xfff) != 0;
    }
  }
  else {
    for (uVar2 = 0; uVar2 != 0xc; uVar2 = uVar2 + 1) {
      if ((uVar1 >> (uVar2 & 0x3f) & 1) != 0) {
        uVar3 = 0xb;
        if (0xb < uVar2) {
          uVar3 = uVar2;
        }
        uVar5 = uVar2 - 1;
        goto LAB_0013e3fe;
      }
    }
  }
  return false;
  while ((uVar1 >> ((byte)uVar5 & 0x3f) & 2) != 0) {
LAB_0013e3fe:
    uVar4 = uVar5;
    uVar5 = uVar4 + 1;
    if (10 < uVar5) {
      uVar5 = uVar3;
      if (uVar4 == 10) {
        First(this,0xc - uVar2);
        return false;
      }
      break;
    }
  }
  Set(this,0,uVar5 - uVar2,true);
  uVar4 = uVar4 + 2;
  Set(this,uVar5 - uVar2,uVar4,false);
  this[uVar4 >> 6]._words[0] = this[uVar4 >> 6]._words[0] | 1L << ((byte)uVar4 & 0x3f);
  return true;
}

Assistant:

bool Next(bool saveWeight = false)
	{	
		size_t pos = 0;
		if (!saveWeight)
		{
			// инкремент слова-как-числа
			for (; pos < _wcount && ++_words[pos] == 0; ++pos);
			// перенос не попал в последнее слово представления?
			if (pos + 1 < _wcount) 
				return true;
			// прошли последнее слово?
			if (pos == _wcount) 
				return false;
			// остановились в последнем слове
			Trim(); 
			return _words[pos] != 0;
		}
		// ищем начало серии из единиц
		for (; pos < _n && !Test(pos); ++pos);
		// единиц нет?
		if (pos == _n) 
			return false;
		// ищем окончание серии
		size_t end = pos + 1;
		for (; end < _n && Test(end); ++end);
		// серия справа?
		if (end == _n)
		{
			// возвращаемся к первому слову с данным весом
			First(end - pos);
			return false;
		}
		// разрываем серию
		Set(0, end - pos - 1, 1); 
		Set(end - pos - 1, end, 0);
		Set(end, 1);
		return true;
	}